

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O3

ENetPeer *
enet_host_connect(ENetHost *host,ENetAddress *address,size_t channelCount,enet_uint32 data)

{
  uint uVar1;
  ulong uVar2;
  size_t sVar3;
  ENetPeer *pEVar4;
  ENetChannel *pEVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  enet_uint32 eVar9;
  size_t sVar10;
  ENetProtocol command;
  ENetProtocol local_62;
  
  sVar3 = 0xff;
  if (channelCount < 0xff) {
    sVar3 = channelCount;
  }
  sVar10 = 1;
  if (channelCount != 0) {
    sVar10 = sVar3;
  }
  uVar2 = host->peerCount;
  if (uVar2 == 0) {
    eVar9 = 0;
  }
  else {
    uVar7 = 0;
    do {
      pEVar4 = host->peer_list[uVar7];
      if (pEVar4->state == ENET_PEER_STATE_DISCONNECTED) goto LAB_001039d9;
      uVar7 = uVar7 + 1;
    } while (uVar2 != uVar7);
    eVar9 = (enet_uint32)uVar2;
    if (0xfffffe < uVar2) {
      return (ENetPeer *)0x0;
    }
  }
  host->peerCount = uVar2 + 1;
  pEVar4 = (ENetPeer *)enet_malloc(0x1d8);
  host->peer_list[uVar2] = pEVar4;
  memset(host->peer_list[uVar2],0,0x1d8);
  pEVar4 = host->peer_list[uVar2];
  pEVar4->host = host;
  pEVar4->incomingPeerID = eVar9;
  pEVar4->outgoingSessionID = 0xff;
  pEVar4->incomingSessionID = 0xff;
  pEVar4->data = (void *)0x0;
  enet_list_clear(&pEVar4->acknowledgements);
  enet_list_clear(&pEVar4->sentReliableCommands);
  enet_list_clear(&pEVar4->sentUnreliableCommands);
  enet_list_clear(&pEVar4->outgoingReliableCommands);
  enet_list_clear(&pEVar4->outgoingUnreliableCommands);
  enet_list_clear(&pEVar4->dispatchedCommands);
  enet_peer_reset(pEVar4);
LAB_001039d9:
  pEVar5 = (ENetChannel *)enet_malloc(sVar10 * 0x50);
  pEVar4->channels = pEVar5;
  if (pEVar5 == (ENetChannel *)0x0) {
    return (ENetPeer *)0x0;
  }
  pEVar4->channelCount = sVar10;
  pEVar4->state = ENET_PEER_STATE_CONNECTING;
  pEVar4->address = *address;
  local_62.connect.connectID = host->randomSeed + 1;
  host->randomSeed = local_62.connect.connectID;
  pEVar4->connectID = local_62.connect.connectID;
  uVar6 = host->outgoingBandwidth;
  if (uVar6 != 0) {
    uVar8 = uVar6 >> 4 & 0xffff000;
    pEVar4->windowSize = uVar8;
    if (uVar8 == 0) {
      pEVar4->windowSize = 0x1000;
      uVar8 = 0x1000;
      goto LAB_00103a65;
    }
    if (uVar8 < 0x10001) goto LAB_00103a65;
  }
  pEVar4->windowSize = 0x10000;
  uVar8 = 0x10000;
LAB_00103a65:
  if (sVar10 != 0) {
    do {
      pEVar5->outgoingReliableSequenceNumber = 0;
      pEVar5->outgoingUnreliableSequenceNumber = 0;
      pEVar5->incomingReliableSequenceNumber = 0;
      pEVar5->incomingUnreliableSequenceNumber = 0;
      enet_list_clear(&pEVar5->incomingReliableCommands);
      enet_list_clear(&pEVar5->incomingUnreliableCommands);
      pEVar5->reliableWindows[7] = 0;
      pEVar5->reliableWindows[8] = 0;
      pEVar5->reliableWindows[9] = 0;
      pEVar5->reliableWindows[10] = 0;
      pEVar5->reliableWindows[0xb] = 0;
      pEVar5->reliableWindows[0xc] = 0;
      pEVar5->reliableWindows[0xd] = 0;
      pEVar5->reliableWindows[0xe] = 0;
      pEVar5->usedReliableWindows = 0;
      pEVar5->reliableWindows[0] = 0;
      pEVar5->reliableWindows[1] = 0;
      pEVar5->reliableWindows[2] = 0;
      pEVar5->reliableWindows[3] = 0;
      pEVar5->reliableWindows[4] = 0;
      pEVar5->reliableWindows[5] = 0;
      pEVar5->reliableWindows[6] = 0;
      pEVar5->reliableWindows[0xf] = 0;
      pEVar5 = pEVar5 + 1;
    } while (pEVar5 < pEVar4->channels + sVar10);
    local_62.connect.connectID = pEVar4->connectID;
    uVar8 = pEVar4->windowSize;
    uVar6 = host->outgoingBandwidth;
  }
  local_62._0_2_ = 0xff82;
  uVar1 = pEVar4->incomingPeerID;
  local_62.connect.outgoingPeerID =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  local_62.connect.incomingSessionID = pEVar4->incomingSessionID;
  local_62.connect.outgoingSessionID = pEVar4->outgoingSessionID;
  uVar1 = pEVar4->mtu;
  local_62.connect.mtu =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  local_62.connect.windowSize =
       uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
  local_62.connect.channelCount = (int)sVar10 << 0x18;
  uVar8 = host->incomingBandwidth;
  local_62.connect.incomingBandwidth =
       uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
  local_62.connect.outgoingBandwidth =
       uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar6 = pEVar4->packetThrottleInterval;
  local_62.connect.packetThrottleInterval =
       uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar6 = pEVar4->packetThrottleAcceleration;
  local_62.connect.packetThrottleAcceleration =
       uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar6 = pEVar4->packetThrottleDeceleration;
  local_62.connect.packetThrottleDeceleration =
       uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  local_62.connect.data =
       data >> 0x18 | (data & 0xff0000) >> 8 | (data & 0xff00) << 8 | data << 0x18;
  enet_peer_queue_outgoing_command(pEVar4,&local_62,(ENetPacket *)0x0,0,0);
  return pEVar4;
}

Assistant:

ENetPeer *
enet_host_connect (ENetHost * host, const ENetAddress * address, size_t channelCount, enet_uint32 data)
{
    ENetPeer * currentPeer;
    ENetChannel * channel;
    ENetProtocol command;
    int i;

    if (channelCount < ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT)
      channelCount = ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT;
    else
    if (channelCount > ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT)
      channelCount = ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT;

    for (i = 0; i < host -> peerCount; i++ )
    {
       currentPeer = host -> peer_list[i];

       if (currentPeer -> state == ENET_PEER_STATE_DISCONNECTED)
         break;
    }

    if (i >= host -> peerCount)
    {
	if (i >= ENET_PROTOCOL_MAXIMUM_PEER_ID) 
	    return NULL;
	host -> peerCount++;
	host -> peer_list[i] = enet_malloc (sizeof (ENetPeer));
	memset (host -> peer_list[i], 0, sizeof (ENetPeer));
	currentPeer = host->peer_list[i];
	currentPeer -> host = host;
	currentPeer -> incomingPeerID = i;
	currentPeer -> outgoingSessionID = currentPeer -> incomingSessionID = 0xFF;
	currentPeer -> data = NULL;

	enet_list_clear (& currentPeer -> acknowledgements);
	enet_list_clear (& currentPeer -> sentReliableCommands);
	enet_list_clear (& currentPeer -> sentUnreliableCommands);
	enet_list_clear (& currentPeer -> outgoingReliableCommands);
	enet_list_clear (& currentPeer -> outgoingUnreliableCommands);
	enet_list_clear (& currentPeer -> dispatchedCommands);

	enet_peer_reset (currentPeer);
    }

    currentPeer -> channels = (ENetChannel *) enet_malloc (channelCount * sizeof (ENetChannel));
    if (currentPeer -> channels == NULL)
      return NULL;
    currentPeer -> channelCount = channelCount;
    currentPeer -> state = ENET_PEER_STATE_CONNECTING;
    currentPeer -> address = * address;
    currentPeer -> connectID = ++ host -> randomSeed;

    if (host -> outgoingBandwidth == 0)
      currentPeer -> windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
    else
      currentPeer -> windowSize = (host -> outgoingBandwidth /
                                    ENET_PEER_WINDOW_SIZE_SCALE) * 
                                      ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;

    if (currentPeer -> windowSize < ENET_PROTOCOL_MINIMUM_WINDOW_SIZE)
      currentPeer -> windowSize = ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
    else
    if (currentPeer -> windowSize > ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE)
      currentPeer -> windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
         
    for (channel = currentPeer -> channels;
         channel < & currentPeer -> channels [channelCount];
         ++ channel)
    {
        channel -> outgoingReliableSequenceNumber = 0;
        channel -> outgoingUnreliableSequenceNumber = 0;
        channel -> incomingReliableSequenceNumber = 0;
        channel -> incomingUnreliableSequenceNumber = 0;

        enet_list_clear (& channel -> incomingReliableCommands);
        enet_list_clear (& channel -> incomingUnreliableCommands);

        channel -> usedReliableWindows = 0;
        memset (channel -> reliableWindows, 0, sizeof (channel -> reliableWindows));
    }
        
    command.header.command = ENET_PROTOCOL_COMMAND_CONNECT | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
    command.header.channelID = 0xFF;
    command.connect.outgoingPeerID = ENET_HOST_TO_NET_32 (currentPeer -> incomingPeerID);
    command.connect.incomingSessionID = currentPeer -> incomingSessionID;
    command.connect.outgoingSessionID = currentPeer -> outgoingSessionID;
    command.connect.mtu = ENET_HOST_TO_NET_32 (currentPeer -> mtu);
    command.connect.windowSize = ENET_HOST_TO_NET_32 (currentPeer -> windowSize);
    command.connect.channelCount = ENET_HOST_TO_NET_32 (channelCount);
    command.connect.incomingBandwidth = ENET_HOST_TO_NET_32 (host -> incomingBandwidth);
    command.connect.outgoingBandwidth = ENET_HOST_TO_NET_32 (host -> outgoingBandwidth);
    command.connect.packetThrottleInterval = ENET_HOST_TO_NET_32 (currentPeer -> packetThrottleInterval);
    command.connect.packetThrottleAcceleration = ENET_HOST_TO_NET_32 (currentPeer -> packetThrottleAcceleration);
    command.connect.packetThrottleDeceleration = ENET_HOST_TO_NET_32 (currentPeer -> packetThrottleDeceleration);
    command.connect.connectID = currentPeer -> connectID;
    command.connect.data = ENET_HOST_TO_NET_32 (data);
 
    enet_peer_queue_outgoing_command (currentPeer, & command, NULL, 0, 0);

    return currentPeer;
}